

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool local_11d;
  uint local_11c;
  uint local_118;
  uint n;
  uchar *p;
  uint matchkey_1;
  uint bits;
  uchar a_2;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  uint matchkey;
  unsigned_short a_1;
  unsigned_short b_1;
  unsigned_short g_1;
  unsigned_short r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uint sixteen;
  uint maxnumcolors;
  uint bits_done;
  uint bpp;
  uint numcolors_done;
  uint alpha_done;
  uint colored_done;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  uint error;
  LodePNGColorMode *mode_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  LodePNGColorProfile *profile_local;
  
  _alpha_done = (ulong)(w * h);
  uVar1 = lodepng_is_greyscale_type(mode);
  numcolors_done = (uint)(uVar1 != 0);
  uVar1 = lodepng_can_have_alpha(mode);
  bpp = (uint)(uVar1 == 0);
  bits_done = 0;
  maxnumcolors = lodepng_get_bpp(mode);
  sixteen = (uint)(maxnumcolors == 1);
  _g = 0x101;
  _a = 0;
  if (maxnumcolors < 9) {
    if (maxnumcolors == 1) {
      local_118 = 2;
    }
    else {
      if (maxnumcolors == 2) {
        local_11c = 4;
      }
      else {
        local_11c = 0x100;
        if (maxnumcolors == 4) {
          local_11c = 0x10;
        }
      }
      local_118 = local_11c;
    }
    _g = local_118;
  }
  color_tree_init((ColorTree *)&numpixels);
  if (mode->bitdepth == 0x10) {
    tree.index = 0;
    tree._132_4_ = 0;
    for (; tree._128_8_ != _alpha_done; tree._128_8_ = tree._128_8_ + 1) {
      getPixelColorRGBA16(&r_1,&g_1,&b_1,&a_1,in,tree._128_8_,mode);
      if (((((r_1 & 0xff) != (int)(uint)r_1 >> 8) || ((g_1 & 0xff) != (int)(uint)g_1 >> 8)) ||
          ((b_1 & 0xff) != (int)(uint)b_1 >> 8)) || ((a_1 & 0xff) != (int)(uint)a_1 >> 8)) {
        _a = 1;
        break;
      }
    }
  }
  if (_a == 0) {
    matchkey_1._3_1_ = 0;
    matchkey_1._2_1_ = 0;
    matchkey_1._1_1_ = 0;
    matchkey_1._0_1_ = '\0';
    tree.index = 0;
    tree._132_4_ = 0;
    for (; tree._128_8_ != _alpha_done; tree._128_8_ = tree._128_8_ + 1) {
      getPixelColorRGBA8((uchar *)((long)&matchkey_1 + 3),(uchar *)((long)&matchkey_1 + 2),
                         (uchar *)((long)&matchkey_1 + 1),(uchar *)&matchkey_1,in,tree._128_8_,mode)
      ;
      if (((sixteen == 0) && (profile->bits < 8)) &&
         (uVar1 = getValueRequiredBits(matchkey_1._3_1_), profile->bits < uVar1)) {
        profile->bits = uVar1;
      }
      sixteen = (uint)(maxnumcolors <= profile->bits);
      if ((numcolors_done == 0) &&
         ((matchkey_1._3_1_ != matchkey_1._2_1_ || (matchkey_1._3_1_ != matchkey_1._1_1_)))) {
        profile->colored = 1;
        numcolors_done = 1;
        if (profile->bits < 8) {
          profile->bits = 8;
        }
      }
      if (bpp == 0) {
        bVar3 = false;
        if (((ushort)matchkey_1._3_1_ == profile->key_r) &&
           (bVar3 = false, (ushort)matchkey_1._2_1_ == profile->key_g)) {
          bVar3 = (ushort)matchkey_1._1_1_ == profile->key_b;
        }
        if (((uchar)matchkey_1 == 0xff) ||
           (((uchar)matchkey_1 == '\0' && ((profile->key == 0 || (bVar3)))))) {
          if (((uchar)matchkey_1 == '\0') && ((profile->alpha == 0 && (profile->key == 0)))) {
            profile->key = 1;
            profile->key_r = (ushort)matchkey_1._3_1_;
            profile->key_g = (ushort)matchkey_1._2_1_;
            profile->key_b = (ushort)matchkey_1._1_1_;
          }
          else if (((uchar)matchkey_1 == 0xff) && ((profile->key != 0 && (bVar3)))) {
            profile->alpha = 1;
            bpp = 1;
            if (profile->bits < 8) {
              profile->bits = 8;
            }
          }
        }
        else {
          profile->alpha = 1;
          bpp = 1;
          if (profile->bits < 8) {
            profile->bits = 8;
          }
        }
      }
      if ((bits_done == 0) &&
         (iVar2 = color_tree_has((ColorTree *)&numpixels,matchkey_1._3_1_,matchkey_1._2_1_,
                                 matchkey_1._1_1_,(uchar)matchkey_1), iVar2 == 0)) {
        color_tree_add((ColorTree *)&numpixels,matchkey_1._3_1_,matchkey_1._2_1_,matchkey_1._1_1_,
                       (uchar)matchkey_1,profile->numcolors);
        if (profile->numcolors < 0x100) {
          uVar1 = profile->numcolors;
          profile->palette[uVar1 << 2] = matchkey_1._3_1_;
          profile->palette[uVar1 * 4 + 1] = matchkey_1._2_1_;
          profile->palette[uVar1 * 4 + 2] = matchkey_1._1_1_;
          profile->palette[uVar1 * 4 + 3] = (uchar)matchkey_1;
        }
        profile->numcolors = profile->numcolors + 1;
        bits_done = (uint)(_g <= profile->numcolors);
      }
      if ((((bpp != 0) && (bits_done != 0)) && (numcolors_done != 0)) && (sixteen != 0)) break;
    }
    if ((profile->key != 0) && (profile->alpha == 0)) {
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != _alpha_done; tree._128_8_ = tree._128_8_ + 1) {
        getPixelColorRGBA8((uchar *)((long)&matchkey_1 + 3),(uchar *)((long)&matchkey_1 + 2),
                           (uchar *)((long)&matchkey_1 + 1),(uchar *)&matchkey_1,in,tree._128_8_,
                           mode);
        if ((((uchar)matchkey_1 != '\0') && ((ushort)matchkey_1._3_1_ == profile->key_r)) &&
           (((ushort)matchkey_1._2_1_ == profile->key_g &&
            ((ushort)matchkey_1._1_1_ == profile->key_b)))) {
          profile->alpha = 1;
          bpp = 1;
        }
      }
    }
    profile->key_r = profile->key_r + profile->key_r * 0x100;
    profile->key_g = profile->key_g + profile->key_g * 0x100;
    profile->key_b = profile->key_b + profile->key_b * 0x100;
  }
  else {
    matchkey._2_2_ = 0;
    matchkey._0_2_ = 0;
    _g_2 = 0;
    _a_2 = 0;
    profile->bits = 0x10;
    bits_done = 1;
    sixteen = 1;
    tree.index = 0;
    tree._132_4_ = 0;
    for (; tree._128_8_ != _alpha_done; tree._128_8_ = tree._128_8_ + 1) {
      getPixelColorRGBA16((unsigned_short *)((long)&matchkey + 2),(unsigned_short *)&matchkey,
                          (unsigned_short *)&g_2,(unsigned_short *)&a_2,in,tree._128_8_,mode);
      if ((numcolors_done == 0) &&
         ((matchkey._2_2_ != (unsigned_short)matchkey || (matchkey._2_2_ != _g_2)))) {
        profile->colored = 1;
        numcolors_done = 1;
      }
      if (bpp == 0) {
        local_11d = false;
        if ((matchkey._2_2_ == profile->key_r) &&
           (local_11d = false, (unsigned_short)matchkey == profile->key_g)) {
          local_11d = _g_2 == profile->key_b;
        }
        bits = (uint)local_11d;
        if ((_a_2 == 0xffff) || ((_a_2 == 0 && ((profile->key == 0 || (bits != 0)))))) {
          if ((_a_2 == 0) && ((profile->alpha == 0 && (profile->key == 0)))) {
            profile->key = 1;
            profile->key_r = matchkey._2_2_;
            profile->key_g = (unsigned_short)matchkey;
            profile->key_b = _g_2;
          }
          else if ((_a_2 == 0xffff) && ((profile->key != 0 && (bits != 0)))) {
            profile->alpha = 1;
            bpp = 1;
          }
        }
        else {
          profile->alpha = 1;
          bpp = 1;
          if (profile->bits < 8) {
            profile->bits = 8;
          }
        }
      }
      if ((((bpp != 0) && (bits_done != 0)) && (numcolors_done != 0)) && (sixteen != 0)) break;
    }
    if ((profile->key != 0) && (profile->alpha == 0)) {
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != _alpha_done; tree._128_8_ = tree._128_8_ + 1) {
        getPixelColorRGBA16((unsigned_short *)((long)&matchkey + 2),(unsigned_short *)&matchkey,
                            (unsigned_short *)&g_2,(unsigned_short *)&a_2,in,tree._128_8_,mode);
        if (((_a_2 != 0) && (matchkey._2_2_ == profile->key_r)) &&
           (((unsigned_short)matchkey == profile->key_g && (_g_2 == profile->key_b)))) {
          profile->alpha = 1;
          bpp = 1;
        }
      }
    }
  }
  color_tree_cleanup((ColorTree *)&numpixels);
  return 0;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}